

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Registry.cpp
# Opt level: O2

FindFunctions * SoapySDR::Registry::listFindFunctions_abi_cxx11_(void)

{
  _Rb_tree_header *p_Var1;
  mapped_type p_Var2;
  mapped_type *pp_Var3;
  _Base_ptr p_Var4;
  map<_275e82af_> *in_RDI;
  
  p_Var1 = &(in_RDI->_M_t)._M_impl.super__Rb_tree_header;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  getFunctionTable_abi_cxx11_();
  for (p_Var4 = getFunctionTable[abi:cxx11]()::table_abi_cxx11_._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      (_Rb_tree_header *)p_Var4 !=
      &getFunctionTable[abi:cxx11]()::table_abi_cxx11_._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    p_Var2 = *(mapped_type *)(p_Var4 + 3);
    pp_Var3 = std::map<$275e82af$>::operator[](in_RDI,(key_type *)(p_Var4 + 1));
    *pp_Var3 = p_Var2;
  }
  return in_RDI;
}

Assistant:

SoapySDR::FindFunctions SoapySDR::Registry::listFindFunctions(void)
{
    FindFunctions functions;
    for (const auto &it : getFunctionTable())
    {
        functions[it.first] = it.second.find;
    }
    return functions;
}